

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap.c
# Opt level: O0

int pcap_list_tstamp_types(pcap_t *p,int **tstamp_typesp)

{
  int *piVar1;
  char *pcVar2;
  int **tstamp_typesp_local;
  pcap_t *p_local;
  
  if (p->tstamp_type_count == 0) {
    *tstamp_typesp = (int *)0x0;
  }
  else {
    piVar1 = (int *)calloc(4,(long)p->tstamp_type_count);
    *tstamp_typesp = piVar1;
    if (*tstamp_typesp == (int *)0x0) {
      piVar1 = __errno_location();
      pcVar2 = pcap_strerror(*piVar1);
      snprintf(p->errbuf,0x101,"malloc: %s",pcVar2);
      return -1;
    }
    memcpy(*tstamp_typesp,p->tstamp_type_list,(long)p->tstamp_type_count << 2);
  }
  return p->tstamp_type_count;
}

Assistant:

int
pcap_list_tstamp_types(pcap_t *p, int **tstamp_typesp)
{
	if (p->tstamp_type_count == 0) {
		/*
		 * We don't support multiple time stamp types.
		 */
		*tstamp_typesp = NULL;
	} else {
		*tstamp_typesp = (int*)calloc(sizeof(**tstamp_typesp),
		    p->tstamp_type_count);
		if (*tstamp_typesp == NULL) {
			(void)pcap_snprintf(p->errbuf, sizeof(p->errbuf),
			    "malloc: %s", pcap_strerror(errno));
			return (PCAP_ERROR);
		}
		(void)memcpy(*tstamp_typesp, p->tstamp_type_list,
		    sizeof(**tstamp_typesp) * p->tstamp_type_count);
	}
	return (p->tstamp_type_count);
}